

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O1

object_t *
acto::core::make_instance
          (actor_ref *context,actor_thread opt,
          unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body)

{
  runtime_t *this;
  object_t *poVar1;
  pointer *__ptr;
  _Head_base<0UL,_acto::actor_*,_false> local_28;
  actor_ref local_20;
  
  this = runtime_t::instance();
  local_20 = (actor_ref)context->object_;
  context->object_ = (object_t *)0x0;
  local_28._M_head_impl =
       (body->_M_t).super___uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_>._M_t.
       super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
       super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_>._M_t.
  super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl = (actor *)0x0;
  poVar1 = runtime_t::make_instance
                     (this,&local_20,opt,
                      (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)&local_28);
  if (local_28._M_head_impl != (actor *)0x0) {
    (*(local_28._M_head_impl)->_vptr_actor[1])();
  }
  local_28._M_head_impl = (actor *)0x0;
  actor_ref::~actor_ref(&local_20);
  return poVar1;
}

Assistant:

object_t* make_instance(actor_ref context,
                        const actor_thread opt,
                        std::unique_ptr<actor> body) {
  return runtime_t::instance()->make_instance(std::move(context), opt,
                                              std::move(body));
}